

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

void RDL_initGraph(RDL_graph *gra,uint V,uint *degree,char owns_edges)

{
  RDL_edge **ppaRVar1;
  RDL_edge *paRVar2;
  uint **ppuVar3;
  RDL_edge **adjList;
  uint i;
  char owns_edges_local;
  uint *degree_local;
  uint V_local;
  RDL_graph *gra_local;
  
  gra->V = V;
  gra->E = 0;
  gra->degree = degree;
  ppaRVar1 = (RDL_edge **)malloc((ulong)V << 3);
  for (adjList._0_4_ = 0; (uint)adjList < V; adjList._0_4_ = (uint)adjList + 1) {
    if (degree[(uint)adjList] != 0) {
      paRVar2 = (RDL_edge *)malloc((ulong)degree[(uint)adjList] << 3);
      ppaRVar1[(uint)adjList] = paRVar2;
    }
  }
  gra->adjList = ppaRVar1;
  if (owns_edges == '\0') {
    gra->edgesAlloced = 0;
    gra->edges = (uint **)0x0;
  }
  else {
    gra->edgesAlloced = 0x40;
    ppuVar3 = (uint **)malloc((ulong)gra->edgesAlloced << 3);
    gra->edges = ppuVar3;
  }
  return;
}

Assistant:

static void RDL_initGraph(RDL_graph *gra, unsigned V, unsigned *degree, char owns_edges)
{
  unsigned i;
  RDL_edge **adjList;

  gra->V = V;
  gra->E = 0;
  gra->degree = degree;

  adjList = malloc(V * sizeof(*adjList));
  for(i=0; i<V; ++i)
  {
    if(degree[i] > 0)
    {
      adjList[i] = malloc(degree[i] * sizeof(**adjList));
    }
  }
  gra->adjList = adjList;

  if (owns_edges) {
    gra->edgesAlloced = 64;
    gra->edges = malloc(gra->edgesAlloced * sizeof(*gra->edges));
  }
  else {
    gra->edgesAlloced = 0;
    gra->edges = NULL;
  }
}